

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::SendRTCPData
          (RTPUDPv4Transmitter *this,char *data,size_t len,char *ip,unsigned_short port)

{
  in_addr_t iVar1;
  int iVar2;
  sockaddr_in addr_serv;
  sockaddr local_48;
  
  iVar2 = -0x5a;
  if (((this->init == true) && (iVar2 = -0x59, this->created == true)) &&
     (iVar2 = -0x5d, len <= this->maxpacksize)) {
    local_48.sa_data[6] = '\0';
    local_48.sa_data[7] = '\0';
    local_48.sa_data[8] = '\0';
    local_48.sa_data[9] = '\0';
    local_48.sa_data[10] = '\0';
    local_48.sa_data[0xb] = '\0';
    local_48.sa_data[0xc] = '\0';
    local_48.sa_data[0xd] = '\0';
    local_48.sa_family = 2;
    local_48.sa_data[0] = '\0';
    local_48.sa_data[1] = '\0';
    local_48.sa_data[2] = '\0';
    local_48.sa_data[3] = '\0';
    local_48.sa_data[4] = '\0';
    local_48.sa_data[5] = '\0';
    iVar1 = inet_addr(ip);
    local_48.sa_data._0_2_ = port << 8 | port >> 8;
    local_48.sa_data._2_4_ = iVar1;
    iVar2 = 0;
    sendto(this->rtpsock,data,len,0,&local_48,0x10);
  }
  return iVar2;
}

Assistant:

int RTPUDPv4Transmitter::SendRTCPData(const char *data, size_t len, const char* ip, unsigned short port)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK

	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_SPECIFIEDSIZETOOBIG;
	}

	struct sockaddr_in addr_serv;
  	memset(&addr_serv, 0, sizeof(addr_serv));
  	addr_serv.sin_family = AF_INET;
  	addr_serv.sin_addr.s_addr = inet_addr(ip);
  	addr_serv.sin_port = htons(port);

	sendto(rtpsock, (const char *)data, len, 0, (const struct sockaddr *)&addr_serv, sizeof(struct sockaddr_in));
	
	MAINMUTEX_UNLOCK
	return 0;
}